

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O0

uint64_t __thiscall
GmmLib::GmmGen12TextureCalc::ScaleFCRectWidth
          (GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint64_t Width)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  PlatformInfo *pPVar5;
  undefined4 extraout_var;
  uint local_74;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint8_t index;
  CCS_UNIT *FCRectAlign;
  uint64_t ScaledWidth;
  uint64_t Width_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen12TextureCalc *this_local;
  long lVar6;
  
  FCRectAlign = (CCS_UNIT *)Width;
  if (((ulong)(pTexInfo->Flags).Gpu >> 1 & 1) != 0) {
    pPVar5 = Context::GetPlatformInfoObj
                       ((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                        super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext);
    iVar3 = (*pPVar5->_vptr_PlatformInfo[10])();
    lVar6 = CONCAT44(extraout_var,iVar3);
    if (pTexInfo->TileMode == LEGACY_TILE_Y) {
      local_44 = 0;
    }
    else {
      if (pTexInfo->TileMode == TILE4) {
        local_48 = 3;
      }
      else {
        if (((int)pTexInfo->TileMode < 0xd) || (0x11 < (int)pTexInfo->TileMode)) {
          if (((int)pTexInfo->TileMode < 0x2b) || (0x2f < (int)pTexInfo->TileMode)) {
            if (((int)pTexInfo->TileMode < 0x4f) || (0x53 < (int)pTexInfo->TileMode)) {
              bVar1 = false;
              if (0x5d < (int)pTexInfo->TileMode) {
                bVar1 = (int)pTexInfo->TileMode < 99;
              }
              local_54 = 6;
              if (bVar1) {
                local_54 = 5;
              }
            }
            else {
              local_54 = 4;
            }
            local_50 = local_54;
          }
          else {
            local_50 = 2;
          }
          local_4c = local_50;
        }
        else {
          local_4c = 1;
        }
        local_48 = local_4c;
      }
      local_44 = local_48;
    }
    if (local_44 < 6) {
      if (pTexInfo->TileMode == LEGACY_TILE_Y) {
        local_5c = 0;
      }
      else {
        if (pTexInfo->TileMode == TILE4) {
          local_60 = 3;
        }
        else {
          if (((int)pTexInfo->TileMode < 0xd) || (0x11 < (int)pTexInfo->TileMode)) {
            if (((int)pTexInfo->TileMode < 0x2b) || (0x2f < (int)pTexInfo->TileMode)) {
              if (((int)pTexInfo->TileMode < 0x4f) || (0x53 < (int)pTexInfo->TileMode)) {
                bVar1 = false;
                if (0x5d < (int)pTexInfo->TileMode) {
                  bVar1 = (int)pTexInfo->TileMode < 99;
                }
                local_6c = 6;
                if (bVar1) {
                  local_6c = 5;
                }
              }
              else {
                local_6c = 4;
              }
              local_68 = local_6c;
            }
            else {
              local_68 = 2;
            }
            local_64 = local_68;
          }
          else {
            local_64 = 1;
          }
          local_60 = local_64;
        }
        local_5c = local_60;
      }
      uVar4 = __GmmLog2(pTexInfo->BitsPerPixel);
      local_74 = (local_5c * 5 + uVar4) - 3;
    }
    else {
      local_74 = 0x1e;
    }
    bVar2 = (byte)local_74;
    if ((local_74 & 0xff) < 0x1e) {
      FCRectAlign = (CCS_UNIT *)
                    (((Width + (*(int *)(lVar6 + (ulong)bVar2 * 0x18) - 1)) -
                     (Width + (*(int *)(lVar6 + (ulong)bVar2 * 0x18) - 1) &
                     (ulong)(*(int *)(lVar6 + (ulong)bVar2 * 0x18) - 1))) /
                    (ulong)(long)*(int *)(lVar6 + (ulong)bVar2 * 0x18 + 0xc));
    }
  }
  return (uint64_t)FCRectAlign;
}

Assistant:

uint64_t GMM_STDCALL GmmLib::GmmGen12TextureCalc::ScaleFCRectWidth(GMM_TEXTURE_INFO *pTexInfo, uint64_t Width)
{
    uint64_t ScaledWidth = Width;
    if(pTexInfo->Flags.Gpu.CCS)
    {
        CCS_UNIT *FCRectAlign = static_cast<PlatformInfoGen12 *>(pGmmLibContext->GetPlatformInfoObj())->GetFCRectAlign();	    
        uint8_t   index       = FCMaxModes;
        if((index = FCMode(pTexInfo->TileMode, pTexInfo->BitsPerPixel)) < FCMaxModes)
        {
            ScaledWidth = GFX_ALIGN(ScaledWidth, FCRectAlign[index].Align.Width);
            ScaledWidth /= FCRectAlign[index].Downscale.Width;
        }
        else
        {
            //Unsupported tiling-type for FastClear
            __GMM_ASSERT(0);
        }
    }

    return ScaledWidth;
}